

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_CutGetCutMinLevel(If_Man_t *p,If_Cut_t *pCut)

{
  If_Obj_t *pIVar1;
  int nMinLevel;
  uint uVar2;
  int i;
  ulong uVar3;
  
  uVar2 = 100000000;
  uVar3 = 0;
  while( true ) {
    if ((byte)pCut->field_0x1f <= uVar3) {
      return uVar2;
    }
    pIVar1 = If_ManObj(p,(int)(&pCut[1].Area)[uVar3]);
    if (pIVar1 == (If_Obj_t *)0x0) break;
    if (*(uint *)pIVar1 >> 0xd <= uVar2) {
      uVar2 = *(uint *)pIVar1 >> 0xd;
    }
    uVar3 = uVar3 + 1;
  }
  return uVar2;
}

Assistant:

int If_CutGetCutMinLevel( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    int i, nMinLevel = IF_INFINITY;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        nMinLevel = IF_MIN( nMinLevel, (int)pLeaf->Level );
    return nMinLevel;
}